

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O2

ConsCell * find_close_prior_cell(conspage *page,LispPTR oldcell)

{
  ConsCell *pCVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar2 = oldcell & 0xff;
  uVar9 = *(uint *)&page->field_0x8 >> 0x10 & 0xff;
  uVar4 = 0;
  while( true ) {
    if (uVar9 == 0) {
      return (ConsCell *)0x0;
    }
    uVar7 = (ulong)uVar9;
    if (uVar2 - 0xe <= uVar9 && uVar9 < uVar2) break;
    uVar9 = (uint)*(byte *)((long)&page->cell6 + (ulong)uVar9 * 2 + 3);
    uVar4 = uVar7;
  }
  do {
    uVar8 = uVar7;
    uVar5 = uVar4;
    uVar9 = *(uint *)((long)&page->cell6 + uVar8 * 2);
    uVar6 = uVar9 >> 0x18;
    uVar3 = (uint)uVar8;
    if (uVar6 <= uVar3) break;
    uVar4 = uVar8;
    uVar7 = (ulong)uVar6;
  } while (uVar6 < uVar2);
  if ((int)uVar5 == 0) {
    uVar2 = *(uint *)&page->field_0x8 & 0xff00ffff | uVar9 >> 8 & 0xff0000;
  }
  else {
    *(char *)((long)&page->cell6 + uVar5 * 2 + 3) = (char)(uVar9 >> 0x18);
    uVar2 = *(uint *)&page->field_0x8;
  }
  pCVar1 = (ConsCell *)((long)&page->cell6 + uVar8 * 2);
  *(uint *)&page->field_0x8 = uVar2 - 0x1000000;
  uVar2 = oldcell - uVar3 & 0xe;
  *pCVar1 = (ConsCell)(uVar2 * 0x8000000 + ((uint)*pCVar1 & 0xfffffff) + 0x80000000);
  if (0xfe < uVar2 + uVar3) {
    error("in fcpc, page overflow.");
  }
  return pCVar1;
}

Assistant:

ConsCell *find_close_prior_cell(struct conspage *page, LispPTR oldcell) {
  unsigned oldoffset = oldcell & 0xFF;
  unsigned offset = page->next_cell;
  unsigned prior = 0;
  unsigned noffset;
  ConsCell *cell;

  while (offset) {
    if ((offset < oldoffset) && (offset >= (oldoffset - 14))) {
      noffset = FREECONS(page, offset)->next_free;
      while ((noffset > offset) && (noffset < oldoffset)) {
        prior = offset;
        offset = noffset;
        noffset = FREECONS(page, offset)->next_free;
      }
      cell = (ConsCell *)((DLword *)page + offset);
      if (prior)
        FREECONS(page, prior)->next_free = FREECONS(page, offset)->next_free;
      else
        page->next_cell = FREECONS(page, offset)->next_free;
      page->count -= 1;
      cell->cdr_code = CDR_ONPAGE | ((oldoffset - offset) >> 1);
      if (254 < (offset + ((cell->cdr_code & 7) << 1))) error("in fcpc, page overflow.");
      return (cell);
    }

    prior = offset;
    offset = ((freecons *)((DLword *)page + offset))->next_free;
  }
  return ((ConsCell *)0); /* No cell close enough */
}